

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  string err;
  string warn;
  Stage stage;
  allocator local_16d1;
  string local_16d0;
  string local_16b0;
  string local_1690;
  Stage local_1670;
  
  tinyusdz::Stage::Stage(&local_1670);
  SimpleScene(&local_1670);
  local_16b0._M_dataplus._M_p = (pointer)&local_16b0.field_2;
  local_16b0._M_string_length = 0;
  local_16b0.field_2._M_local_buf[0] = '\0';
  local_16d0._M_dataplus._M_p = (pointer)&local_16d0.field_2;
  local_16d0._M_string_length = 0;
  local_16d0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1690,"output.usda",&local_16d1);
  bVar1 = tinyusdz::usda::SaveAsUSDA(&local_1690,&local_1670,&local_16b0,&local_16d0);
  std::__cxx11::string::~string((string *)&local_1690);
  if (local_16b0._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_16b0);
    std::operator<<(poVar2,"\n");
  }
  if (local_16d0._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERR: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_16d0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_16d0);
  std::__cxx11::string::~string((string *)&local_16b0);
  tinyusdz::Stage::~Stage(&local_1670);
  return bVar1 - 1;
}

Assistant:

int main(int argc, char **argv)
{
  tinyusdz::Stage stage; // empty scene

  SimpleScene(&stage);

  std::string warn;
  std::string err;
  bool ret = tinyusdz::usda::SaveAsUSDA("output.usda", stage, &warn, &err);

  if (warn.size()) {
    std::cout << "WARN: " << warn << "\n";
  }

  if (err.size()) {
    std::cerr << "ERR: " << err << "\n";
  }

  return ret ? EXIT_SUCCESS : -1;
}